

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_round_box.cxx
# Opt level: O3

void draw(int which,int x,int y,int w,int h,int inset,Fl_Color color)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  int iVar2;
  int iVar3;
  code *pcVar4;
  ulong uVar5;
  uint uVar6;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int local_68;
  ulong uVar7;
  
  uVar1 = inset * 2;
  if (w <= (int)uVar1) {
    uVar1 = (w - (w + -1 >> 0x1f)) - 1;
    inset = (int)uVar1 >> 1;
    uVar1 = uVar1 & 0xfffffffe;
  }
  if (h <= (int)uVar1) {
    uVar1 = (h - (h + -1 >> 0x1f)) - 1;
    inset = (int)uVar1 >> 1;
    uVar1 = uVar1 & 0xfffffffe;
  }
  uVar9 = w - uVar1;
  uVar1 = h - uVar1;
  uVar10 = uVar9;
  if (h < w) {
    uVar10 = uVar1;
  }
  if ((int)uVar10 < 2) {
    return;
  }
  uVar6 = x + inset;
  uVar7 = (ulong)uVar6;
  uVar11 = y + inset;
  uVar5 = (ulong)uVar11;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)color);
  if (which < 2) {
    UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20];
    if (which != 0) {
      iVar2 = 0x168;
      if (h < w) {
        iVar2 = 0x10e;
      }
      (*UNRECOVERED_JUMPTABLE_00)
                (0x406c200000000000,fl_graphics_driver,uVar7,(ulong)((uVar11 + uVar1) - uVar10),
                 (ulong)uVar10,(ulong)uVar10);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                ((double)iVar2,0x4079500000000000,fl_graphics_driver,
                 (ulong)((uVar6 + uVar9) - uVar10),(ulong)uVar11,(ulong)uVar10,(ulong)uVar10);
      goto LAB_001f40f4;
    }
    iVar2 = 0xb4;
    if (h < w) {
      iVar2 = 0x5a;
    }
    (*UNRECOVERED_JUMPTABLE_00)
              (0x4046800000000000,fl_graphics_driver,(ulong)((uVar9 + uVar6) - uVar10),(ulong)uVar11
               ,(ulong)uVar10,(ulong)uVar10);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              ((double)iVar2,0x406c200000000000,fl_graphics_driver,uVar7,
               (ulong)((uVar11 + uVar1) - uVar10),(ulong)uVar10,(ulong)uVar10);
    if (h <= w) {
      if (w <= h) {
        return;
      }
      goto LAB_001f42bc;
    }
  }
  else {
    pcVar4 = fl_arc_i;
    if (which == 3) {
      pcVar4 = fl_pie;
    }
    iVar2 = -0x5a;
    if (w <= h) {
      iVar2 = 0;
    }
    iVar3 = 0xb4;
    if (h < w) {
      iVar3 = 0x5a;
    }
    iVar8 = 0x168;
    if (h < w) {
      iVar8 = 0x10e;
    }
    (*pcVar4)((double)iVar2,(uVar6 + uVar9) - uVar10,uVar5,uVar10,uVar10);
    (*pcVar4)((double)iVar3,(double)iVar8,uVar6,(uVar11 + uVar1) - uVar10,uVar10,uVar10);
    if (which == 3) {
      if (w < h) {
        uVar5 = (ulong)((uVar10 >> 1) + uVar11);
        uVar1 = uVar1 - (uVar10 & 0x7ffffffe);
        UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
      }
      else {
        if (w <= h) {
          return;
        }
        uVar7 = (ulong)((uVar1 >> 1) + uVar6);
        uVar9 = uVar9 - (uVar1 & 0x7ffffffe);
        UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
      }
      (*UNRECOVERED_JUMPTABLE_00)(fl_graphics_driver,uVar7,uVar5,(ulong)uVar9,(ulong)uVar1);
      return;
    }
LAB_001f40f4:
    if (h <= w) {
      if (w <= h) {
        return;
      }
      if ((which != 0) &&
         ((*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)((uVar6 + (uVar1 >> 1)) - 1),
                     (ulong)((uVar1 + uVar11) - 1),(ulong)(((uVar9 + uVar6) - (uVar1 >> 1)) + 1)),
         which == 1)) {
        return;
      }
LAB_001f42bc:
      local_68 = uVar9 + uVar6;
      uVar6 = (uVar6 + (uVar1 >> 1)) - 1;
      local_68 = local_68 - (uVar1 >> 1);
      UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6];
      goto LAB_001f42e4;
    }
    if ((which != 0) &&
       ((*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)((uVar6 + uVar9) - 1),
                   (ulong)((uVar11 + (uVar10 >> 1)) - 1),
                   (ulong)(((uVar1 + uVar11) - (uVar10 >> 1)) + 1)), which == 1)) {
      return;
    }
  }
  uVar5 = (ulong)((uVar11 + (uVar10 >> 1)) - 1);
  local_68 = (uVar1 + uVar11) - (uVar10 >> 1);
  UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
LAB_001f42e4:
  (*UNRECOVERED_JUMPTABLE_00)(fl_graphics_driver,(ulong)uVar6,uVar5,(ulong)(local_68 + 1));
  return;
}

Assistant:

static void draw(int which, int x,int y,int w,int h, int inset, Fl_Color color)
{
  if (inset*2 >= w) inset = (w-1)/2;
  if (inset*2 >= h) inset = (h-1)/2;
  x += inset;
  y += inset;
  w -= 2*inset;
  h -= 2*inset;
  int d = w <= h ? w : h;
  if (d <= 1) return;
  fl_color(color);
  void (*f)(int,int,int,int,double,double);
  f = (which==FILL) ? fl_pie : fl_arc_i;
  if (which >= CLOSED) {
    f(x+w-d, y, d, d, w<=h ? 0 : -90, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, w<=h ? 360 : 270);
  } else if (which == UPPER_LEFT) {
    f(x+w-d, y, d, d, 45, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, 225);
  } else { // LOWER_RIGHT
    f(x, y+h-d, d, d, 225, w<=h ? 360 : 270);
    f(x+w-d, y, d, d, w<=h ? 360 : 270, 360+45);
  }
  if (which == FILL) {
    if (w < h)
      fl_rectf(x, y+d/2, w, h-(d&-2));
    else if (w > h)
      fl_rectf(x+d/2, y, w-(d&-2), h);
  } else {
    if (w < h) {
      if (which != UPPER_LEFT) fl_yxline(x+w-1, y+d/2-1, y+h-d/2+1);
      if (which != LOWER_RIGHT) fl_yxline(x, y+d/2-1, y+h-d/2+1);
    } else if (w > h) {
      if (which != UPPER_LEFT) fl_xyline(x+d/2-1, y+h-1, x+w-d/2+1);
      if (which != LOWER_RIGHT) fl_xyline(x+d/2-1, y, x+w-d/2+1);
    }
  }
}